

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three-colour-triplets-recognizer.cpp
# Opt level: O0

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::ThreeColourTripletsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,ThreeColourTripletsRecognizer *this)

{
  initializer_list<mahjong::Pattern> __l;
  allocator<mahjong::Pattern> local_4e;
  less<mahjong::Pattern> local_4d;
  Pattern local_4c;
  iterator local_48;
  size_type local_40;
  int local_34;
  iterator pvStack_30;
  value_type_conflict it;
  iterator __end1;
  iterator __begin1;
  array<int,_9UL> *__range1;
  ThreeColourTripletsRecognizer *this_local;
  
  __begin1 = (this->front_tile_count_of_triplets_or_quads)._M_elems;
  __range1 = (array<int,_9UL> *)this;
  this_local = (ThreeColourTripletsRecognizer *)__return_storage_ptr__;
  __end1 = std::array<int,_9UL>::begin((array<int,_9UL> *)__begin1);
  pvStack_30 = std::array<int,_9UL>::end((array<int,_9UL> *)__begin1);
  while( true ) {
    if (__end1 == pvStack_30) {
      memset(__return_storage_ptr__,0,0x30);
      std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
      set(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    local_34 = *__end1;
    if (local_34 == 3) break;
    __end1 = __end1 + 1;
  }
  local_4c = ThreeColourTriplets;
  local_48 = &local_4c;
  local_40 = 1;
  std::allocator<mahjong::Pattern>::allocator(&local_4e);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            (__return_storage_ptr__,__l,&local_4d,&local_4e);
  std::allocator<mahjong::Pattern>::~allocator(&local_4e);
  return __return_storage_ptr__;
}

Assistant:

std::set<Pattern> ThreeColourTripletsRecognizer::recognize()
{
	for (auto it : front_tile_count_of_triplets_or_quads)
	{
		if (it == 3)
		{
			return { Pattern::ThreeColourTriplets };
		}
	}

	return {};
}